

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.h
# Opt level: O0

int Abc_NodeIsTravIdCurrent(Abc_Obj_t *p)

{
  int iVar1;
  Abc_Ntk_t *pAVar2;
  Abc_Obj_t *p_local;
  
  iVar1 = Abc_NodeTravId(p);
  pAVar2 = Abc_ObjNtk(p);
  return (int)(iVar1 == pAVar2->nTravIds);
}

Assistant:

static inline int         Abc_NodeIsTravIdCurrent( Abc_Obj_t * p )          { return (Abc_NodeTravId(p) == Abc_ObjNtk(p)->nTravIds);                                }